

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunConstantPropagation(ExpressionContext *ctx,VmModule *module,VmValue *value,bool nested)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Allocator *pAVar6;
  SynBase *pSVar7;
  Allocator *pAVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  VmFunction *pVVar12;
  VmBlock *pVVar13;
  VmValue **ppVVar14;
  VmInstruction *pVVar15;
  VmConstant **ppVVar16;
  VmConstant *pVVar17;
  VariableData *local_488;
  uint index;
  uint ptr;
  uint elementSize;
  uint arrayLength;
  VmInstruction *userInst;
  uint i_1;
  VmConstant *constant_1;
  int iValue;
  float fValue;
  VmConstant *constant;
  uint local_17c;
  undefined1 local_178 [4];
  uint i;
  SmallArray<VmConstant_*,_32U> consts;
  VmInstruction *inst;
  VmInstruction *next_1;
  VmInstruction *curr_1;
  VmBlock *block;
  VmBlock *next;
  VmBlock *curr;
  VmFunction *function;
  bool nested_local;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar12 = getType<VmFunction>(value);
  if (pVVar12 == (VmFunction *)0x0) {
    pVVar13 = getType<VmBlock>(value);
    if (pVVar13 == (VmBlock *)0x0) {
      consts.allocator = (Allocator *)getType<VmInstruction>(value);
      if (((VmInstruction *)consts.allocator != (VmInstruction *)0x0) &&
         ((((bVar9 = VmType::operator!=(&(((VmInstruction *)consts.allocator)->super_VmValue).type,
                                        &VmType::Int), !bVar9 ||
            (bVar9 = VmType::operator!=((VmType *)(consts.allocator + 2),&VmType::Double), !bVar9))
           || (bVar9 = VmType::operator!=((VmType *)(consts.allocator + 2),&VmType::Long), !bVar9))
          || (*(int *)&consts.allocator[2]._vptr_Allocator == 6)))) {
        SmallArray<VmConstant_*,_32U>::SmallArray
                  ((SmallArray<VmConstant_*,_32U> *)local_178,module->allocator);
        for (local_17c = 0; uVar11 = local_17c,
            uVar10 = SmallArray<VmValue_*,_4U>::size
                               ((SmallArray<VmValue_*,_4U> *)(consts.allocator + 0x14)),
            pAVar8 = consts.allocator, uVar11 < uVar10; local_17c = local_17c + 1) {
          ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                               ((SmallArray<VmValue_*,_4U> *)(consts.allocator + 0x14),local_17c);
          _fValue = getType<VmConstant>(*ppVVar14);
          if (_fValue == (VmConstant *)0x0) {
            if (nested) {
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)(consts.allocator + 0x14),local_17c
                                   );
              RunConstantPropagation(ctx,module,*ppVVar14,true);
              ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                   ((SmallArray<VmValue_*,_4U> *)(consts.allocator + 0x14),local_17c
                                   );
              _fValue = getType<VmConstant>(*ppVVar14);
            }
            if (_fValue == (VmConstant *)0x0) goto LAB_00235b36;
          }
          SmallArray<VmConstant_*,_32U>::push_back
                    ((SmallArray<VmConstant_*,_32U> *)local_178,(VmConstant **)&fValue);
        }
        switch(*(undefined4 *)&consts.allocator[0x13]._vptr_Allocator) {
        case 7:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,(*ppVVar16)->iValue);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              pVVar17 = CreateConstantDouble(pAVar6,pSVar7,(*ppVVar16)->dValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                pVVar17 = CreateConstantLong(pAVar6,pSVar7,(*ppVVar16)->lValue);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        default:
          break;
        case 0xf:
          pAVar6 = module->allocator;
          pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          pVVar17 = CreateConstantInt(pAVar6,pSVar7,(int)(*ppVVar16)->dValue);
          anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                    (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,&module->constantPropagations)
          ;
          break;
        case 0x10:
          pAVar6 = module->allocator;
          pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          pVVar17 = CreateConstantLong(pAVar6,pSVar7,(long)(*ppVVar16)->dValue);
          anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                    (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,&module->constantPropagations)
          ;
          break;
        case 0x11:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          pVVar17 = CreateConstantInt(module->allocator,
                                      (SynBase *)consts.allocator[4]._vptr_Allocator,
                                      (int)(float)(*ppVVar16)->dValue);
          pVVar17->isFloat = true;
          for (userInst._4_4_ = 0;
              uVar11 = SmallArray<VmValue_*,_8U>::size
                                 ((SmallArray<VmValue_*,_8U> *)(consts.allocator + 8)),
              userInst._4_4_ < uVar11; userInst._4_4_ = userInst._4_4_ + 1) {
            ppVVar14 = SmallArray<VmValue_*,_8U>::operator[]
                                 ((SmallArray<VmValue_*,_8U> *)(consts.allocator + 8),userInst._4_4_
                                 );
            pVVar15 = getType<VmInstruction>(*ppVVar14);
            if ((pVVar15 != (VmInstruction *)0x0) && (pVVar15->cmd == VM_INST_CALL)) {
              ppVVar14 = SmallArray<VmValue_*,_8U>::operator[]
                                   ((SmallArray<VmValue_*,_8U> *)(consts.allocator + 8),
                                    userInst._4_4_);
              anon_unknown.dwarf_c91b1::ReplaceValue
                        (module,*ppVVar14,(VmValue *)consts.allocator,&pVVar17->super_VmValue);
              module->constantPropagations = module->constantPropagations + 1;
            }
          }
          SmallArray<VmValue_*,_128U>::clear(&module->tempUsers);
          break;
        case 0x12:
          pAVar6 = module->allocator;
          pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          pVVar17 = CreateConstantDouble(pAVar6,pSVar7,(double)(*ppVVar16)->iValue);
          anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                    (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,&module->constantPropagations)
          ;
          break;
        case 0x13:
          pAVar6 = module->allocator;
          pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          pVVar17 = CreateConstantDouble(pAVar6,pSVar7,(double)(*ppVVar16)->lValue);
          anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                    (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,&module->constantPropagations)
          ;
          break;
        case 0x14:
          pAVar6 = module->allocator;
          pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          pVVar17 = CreateConstantLong(pAVar6,pSVar7,(long)(*ppVVar16)->iValue);
          anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                    (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,&module->constantPropagations)
          ;
          break;
        case 0x15:
          pAVar6 = module->allocator;
          pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          pVVar17 = CreateConstantInt(pAVar6,pSVar7,(int)(*ppVVar16)->lValue);
          anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                    (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,&module->constantPropagations)
          ;
          break;
        case 0x16:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          uVar11 = (*ppVVar16)->iValue;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,1);
          iVar3 = (*ppVVar16)->iValue;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,2);
          iVar2 = (*ppVVar16)->iValue;
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,3);
          pAVar8 = consts.allocator;
          uVar10 = (*ppVVar16)->iValue;
          if (uVar10 < uVar11) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,2);
            pVVar17 = CreateConstantPointer
                                (pAVar6,pSVar7,iVar2 + iVar3 * uVar10,(*ppVVar16)->container,
                                 (TypeBase *)consts.allocator[3]._vptr_Allocator,true);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          break;
        case 0x22:
          if (*(int *)&consts.allocator[2]._vptr_Allocator == 6) {
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            bVar9 = false;
            if ((*ppVVar16)->container != (VariableData *)0x0) {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              bVar9 = (*ppVVar16)->container != (VariableData *)0x0;
            }
            pAVar8 = consts.allocator;
            if (bVar9) {
              __assert_fail("!(consts[0]->container && consts[1]->container)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x123e,
                            "void RunConstantPropagation(ExpressionContext &, VmModule *, VmValue *, bool)"
                           );
            }
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            iVar2 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            if ((*ppVVar16)->container == (VariableData *)0x0) {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              local_488 = (*ppVVar16)->container;
            }
            else {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              local_488 = (*ppVVar16)->container;
            }
            pVVar17 = CreateConstantPointer
                                (pAVar6,pSVar7,iVar3 + iVar2,local_488,
                                 (TypeBase *)consts.allocator[3]._vptr_Allocator,true);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              iVar3 = (*ppVVar16)->iValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,iVar3 + (*ppVVar16)->iValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Double);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                dVar1 = (*ppVVar16)->dValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantDouble(pAVar6,pSVar7,dVar1 + (*ppVVar16)->dValue);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
              else {
                bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
                pAVar8 = consts.allocator;
                if (bVar9) {
                  pAVar6 = module->allocator;
                  pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                  ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                       ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                  lVar4 = (*ppVVar16)->lValue;
                  ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                       ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                  pVVar17 = CreateConstantLong(pAVar6,pSVar7,lVar4 + (*ppVVar16)->lValue);
                  anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                            (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                             &module->constantPropagations);
                }
              }
            }
          }
          break;
        case 0x23:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,iVar3 - (*ppVVar16)->iValue);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              dVar1 = (*ppVVar16)->dValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantDouble(pAVar6,pSVar7,dVar1 - (*ppVVar16)->dValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantLong(pAVar6,pSVar7,lVar4 - (*ppVVar16)->lValue);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x24:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,iVar3 * (*ppVVar16)->iValue);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              dVar1 = (*ppVVar16)->dValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantDouble(pAVar6,pSVar7,dVar1 * (*ppVVar16)->dValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantLong(pAVar6,pSVar7,lVar4 * (*ppVVar16)->lValue);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x25:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,1);
          bVar9 = IsConstantZero(&(*ppVVar16)->super_VmValue);
          if (!bVar9) {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              iVar3 = (*ppVVar16)->iValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,iVar3 / (*ppVVar16)->iValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Double);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                dVar1 = (*ppVVar16)->dValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantDouble(pAVar6,pSVar7,dVar1 / (*ppVVar16)->dValue);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
              else {
                bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
                pAVar8 = consts.allocator;
                if (bVar9) {
                  pAVar6 = module->allocator;
                  pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                  ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                       ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                  lVar4 = (*ppVVar16)->lValue;
                  ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                       ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                  pVVar17 = CreateConstantLong(pAVar6,pSVar7,lVar4 / (*ppVVar16)->lValue);
                  anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                            (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                             &module->constantPropagations);
                }
              }
            }
          }
          break;
        case 0x27:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,1);
          bVar9 = IsConstantZero(&(*ppVVar16)->super_VmValue);
          if (!bVar9) {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              iVar3 = (*ppVVar16)->iValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,iVar3 % (*ppVVar16)->iValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantLong(pAVar6,pSVar7,lVar4 % (*ppVVar16)->lValue);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x28:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(iVar3 < (*ppVVar16)->iValue));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              dVar1 = (*ppVVar16)->dValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(dVar1 < (*ppVVar16)->dValue));
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(lVar4 < (*ppVVar16)->lValue));
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x29:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)((*ppVVar16)->iValue < iVar3));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              dVar1 = (*ppVVar16)->dValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)((*ppVVar16)->dValue < dVar1));
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)((*ppVVar16)->lValue < lVar4));
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x2a:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(iVar3 <= (*ppVVar16)->iValue));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              dVar1 = (*ppVVar16)->dValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(dVar1 <= (*ppVVar16)->dValue));
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(lVar4 <= (*ppVVar16)->lValue));
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x2b:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)((*ppVVar16)->iValue <= iVar3));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              dVar1 = (*ppVVar16)->dValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)((*ppVVar16)->dValue <= dVar1));
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)((*ppVVar16)->lValue <= lVar4));
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x2c:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(iVar3 == (*ppVVar16)->iValue));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              dVar1 = (*ppVVar16)->dValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,-(uint)(dVar1 == (*ppVVar16)->dValue) & 1);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(lVar4 == (*ppVVar16)->lValue));
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x2d:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(iVar3 != (*ppVVar16)->iValue));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              dVar1 = (*ppVVar16)->dValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,-(uint)(dVar1 != (*ppVVar16)->dValue) & 1);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                lVar4 = (*ppVVar16)->lValue;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,1);
                pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)(lVar4 != (*ppVVar16)->lValue));
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x2e:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,iVar3 << ((byte)(*ppVVar16)->iValue & 0x1f));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              lVar4 = (*ppVVar16)->lValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantLong(pAVar6,pSVar7,lVar4 << ((byte)(*ppVVar16)->lValue & 0x3f)
                                          );
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
          }
          break;
        case 0x2f:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            iVar3 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,iVar3 >> ((byte)(*ppVVar16)->iValue & 0x1f));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              lVar4 = (*ppVVar16)->lValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantLong(pAVar6,pSVar7,lVar4 >> ((byte)(*ppVVar16)->lValue & 0x3f)
                                          );
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
          }
          break;
        case 0x30:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            uVar11 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,uVar11 & (*ppVVar16)->iValue);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              uVar5 = (*ppVVar16)->lValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantLong(pAVar6,pSVar7,uVar5 & (*ppVVar16)->lValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
          }
          break;
        case 0x31:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            uVar11 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,uVar11 | (*ppVVar16)->iValue);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              uVar5 = (*ppVVar16)->lValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantLong(pAVar6,pSVar7,uVar5 | (*ppVVar16)->lValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
          }
          break;
        case 0x32:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            uVar11 = (*ppVVar16)->iValue;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,1);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,uVar11 ^ (*ppVVar16)->iValue);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              uVar5 = (*ppVVar16)->lValue;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,1);
              pVVar17 = CreateConstantLong(pAVar6,pSVar7,uVar5 ^ (*ppVVar16)->lValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
          }
          break;
        case 0x44:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,-(*ppVVar16)->iValue);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Double);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              pVVar17 = CreateConstantDouble(pAVar6,pSVar7,-(*ppVVar16)->dValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
            else {
              bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
              pAVar8 = consts.allocator;
              if (bVar9) {
                pAVar6 = module->allocator;
                pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
                ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                     ((SmallArray<VmConstant_*,_32U> *)local_178,0);
                pVVar17 = CreateConstantLong(pAVar6,pSVar7,-(*ppVVar16)->lValue);
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                           &module->constantPropagations);
              }
            }
          }
          break;
        case 0x45:
          bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,~(*ppVVar16)->iValue);
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            bVar9 = VmType::operator==((VmType *)(consts.allocator + 2),&VmType::Long);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              pVVar17 = CreateConstantLong(pAVar6,pSVar7,~(*ppVVar16)->lValue);
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
          }
          break;
        case 0x46:
          ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                               ((SmallArray<VmConstant_*,_32U> *)local_178,0);
          bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Int);
          pAVar8 = consts.allocator;
          if (bVar9) {
            pAVar6 = module->allocator;
            pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)((*ppVVar16)->iValue == 0));
            anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                      (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                       &module->constantPropagations);
          }
          else {
            ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                 ((SmallArray<VmConstant_*,_32U> *)local_178,0);
            bVar9 = VmType::operator==(&((*ppVVar16)->super_VmValue).type,&VmType::Long);
            pAVar8 = consts.allocator;
            if (bVar9) {
              pAVar6 = module->allocator;
              pSVar7 = (SynBase *)consts.allocator[4]._vptr_Allocator;
              ppVVar16 = SmallArray<VmConstant_*,_32U>::operator[]
                                   ((SmallArray<VmConstant_*,_32U> *)local_178,0);
              pVVar17 = CreateConstantInt(pAVar6,pSVar7,(uint)((*ppVVar16)->lValue == 0));
              anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                        (module,(VmValue *)pAVar8,&pVVar17->super_VmValue,
                         &module->constantPropagations);
            }
          }
        }
LAB_00235b36:
        SmallArray<VmConstant_*,_32U>::~SmallArray((SmallArray<VmConstant_*,_32U> *)local_178);
      }
    }
    else {
      next_1 = pVVar13->firstInstruction;
      while (next_1 != (VmInstruction *)0x0) {
        pVVar15 = next_1->nextSibling;
        RunConstantPropagation(ctx,module,&next_1->super_VmValue,nested);
        next_1 = pVVar15;
      }
    }
  }
  else {
    next = pVVar12->firstBlock;
    while (next != (VmBlock *)0x0) {
      pVVar13 = next->nextSibling;
      RunConstantPropagation(ctx,module,&next->super_VmValue,nested);
      next = pVVar13;
    }
  }
  return;
}

Assistant:

void RunConstantPropagation(ExpressionContext &ctx, VmModule *module, VmValue* value, bool nested)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunConstantPropagation(ctx, module, curr, nested);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		VmInstruction *curr = block->firstInstruction;

		while(curr)
		{
			VmInstruction *next = curr->nextSibling;
			RunConstantPropagation(ctx, module, curr, nested);
			curr = next;
		}
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		if(inst->type != VmType::Int && inst->type != VmType::Double && inst->type != VmType::Long && inst->type.type != VM_TYPE_POINTER)
			return;

		SmallArray<VmConstant*, 32> consts(module->allocator);

		for(unsigned i = 0; i < inst->arguments.size(); i++)
		{
			VmConstant *constant = getType<VmConstant>(inst->arguments[i]);

			if(!constant)
			{
				if(nested)
				{
					RunConstantPropagation(ctx, module, inst->arguments[i], true);

					constant = getType<VmConstant>(inst->arguments[i]);
				}

				if(!constant)
					return;
			}

			consts.push_back(constant);
		}

		switch(inst->cmd)
		{
		case VM_INST_LOAD_IMMEDIATE:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue), &module->constantPropagations);
			break;
		case VM_INST_DOUBLE_TO_INT:
			ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, int(consts[0]->dValue)), &module->constantPropagations);
			break;
		case VM_INST_DOUBLE_TO_LONG:
			ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, (long long)(consts[0]->dValue)), &module->constantPropagations);
			break;
		case VM_INST_DOUBLE_TO_FLOAT:
		{
			float fValue = float(consts[0]->dValue);

			int iValue;
			assert(sizeof(int) == sizeof(float));
			memcpy(&iValue, &fValue, sizeof(float));

			VmConstant *constant = CreateConstantInt(module->allocator, inst->source, iValue);

			constant->isFloat = true;

			// Replace only call instuction users
			for(unsigned i = 0; i < inst->users.size(); i++)
			{
				if(VmInstruction *userInst = getType<VmInstruction>(inst->users[i]))
				{
					if(userInst->cmd == VM_INST_CALL)
					{
						ReplaceValue(module, inst->users[i], inst, constant);
						module->constantPropagations++;
					}
				}
			}

			module->tempUsers.clear();
		}
			break;
		case VM_INST_INT_TO_DOUBLE:
			ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, double(consts[0]->iValue)), &module->constantPropagations);
			break;
		case VM_INST_LONG_TO_DOUBLE:
			ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, double(consts[0]->lValue)), &module->constantPropagations);
			break;
		case VM_INST_INT_TO_LONG:
			ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, (long long)(consts[0]->iValue)), &module->constantPropagations);
			break;
		case VM_INST_LONG_TO_INT:
			ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, int(consts[0]->lValue)), &module->constantPropagations);
			break;
		case VM_INST_ADD:
			if(inst->type.type == VM_TYPE_POINTER)
			{
				// Both arguments can't be based on an offset
				assert(!(consts[0]->container && consts[1]->container));

				ReplaceValueUsersWith(module, inst, CreateConstantPointer(module->allocator, inst->source, consts[0]->iValue + consts[1]->iValue, consts[0]->container ? consts[0]->container : consts[1]->container, inst->type.structType, true), &module->constantPropagations);
			}
			else
			{
				if(inst->type == VmType::Int)
					ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue + consts[1]->iValue), &module->constantPropagations);
				else if(inst->type == VmType::Double)
					ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue + consts[1]->dValue), &module->constantPropagations);
				else if(inst->type == VmType::Long)
					ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue + consts[1]->lValue), &module->constantPropagations);
			}
			break;
		case VM_INST_SUB:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue - consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue - consts[1]->dValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue - consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_MUL:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue * consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue * consts[1]->dValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue * consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_DIV:
			if(!IsConstantZero(consts[1]))
			{
				if(inst->type == VmType::Int)
					ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue / consts[1]->iValue), &module->constantPropagations);
				else if(inst->type == VmType::Double)
					ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue / consts[1]->dValue), &module->constantPropagations);
				else if(inst->type == VmType::Long)
					ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue / consts[1]->lValue), &module->constantPropagations);
			}
			break;
		case VM_INST_MOD:
			if(!IsConstantZero(consts[1]))
			{
				if(inst->type == VmType::Int)
					ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue % consts[1]->iValue), &module->constantPropagations);
				else if(inst->type == VmType::Long)
					ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue % consts[1]->lValue), &module->constantPropagations);
			}
			break;
		case VM_INST_LESS:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue < consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue < consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue < consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_GREATER:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue > consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue > consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue > consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_LESS_EQUAL:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue <= consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue <= consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue <= consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_GREATER_EQUAL:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue >= consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue >= consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue >= consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_EQUAL:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue == consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue == consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue == consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_NOT_EQUAL:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue != consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue != consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue != consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_SHL:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue << consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue << consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_SHR:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue >> consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue >> consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_BIT_AND:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue & consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue & consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_BIT_OR:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue | consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue | consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_BIT_XOR:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue ^ consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue ^ consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_NEG:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, -consts[0]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, -consts[0]->dValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, -consts[0]->lValue), &module->constantPropagations);
			break;
		case VM_INST_BIT_NOT:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, ~consts[0]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, ~consts[0]->lValue), &module->constantPropagations);
			break;
		case VM_INST_LOG_NOT:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, !consts[0]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, !consts[0]->lValue), &module->constantPropagations);
			break;
		case VM_INST_INDEX:
			{
				unsigned arrayLength = consts[0]->iValue;
				unsigned elementSize = consts[1]->iValue;

				unsigned ptr = consts[2]->iValue;
				unsigned index = consts[3]->iValue;

				if(index < arrayLength)
					ReplaceValueUsersWith(module, inst, CreateConstantPointer(module->allocator, inst->source, ptr + elementSize * index, consts[2]->container, inst->type.structType, true), &module->constantPropagations);
			}
			break;
		default:
			break;
		}
	}
}